

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_TestBase64_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  byte bVar1;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  ulong in_RAX;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  flatcc_builder_ref_t *pfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong *buf_00;
  ulong uVar12;
  flatcc_builder_t *B;
  ulong uVar13;
  ulong *puVar14;
  flatcc_builder_ref_t ref;
  int more;
  undefined8 local_38;
  
  *result = 0;
  local_38 = in_RAX;
  iVar2 = flatcc_builder_start_table(ctx->ctx,3);
  if (iVar2 != 0) goto LAB_00111a12;
  if ((buf == end) || (*buf != '{')) {
    local_38 = local_38 & 0xffffffff;
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
    goto LAB_00111a0b;
  }
  puVar14 = (ulong *)(buf + 1);
  if ((long)end - (long)puVar14 < 2) {
LAB_00111a4b:
    puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
  }
  else if ((char)(byte)*puVar14 < '!') {
    if (((byte)*puVar14 != 0x20) || (buf[2] < '!')) goto LAB_00111a4b;
    puVar14 = (ulong *)(buf + 2);
  }
  if ((puVar14 == (ulong *)end) || ((byte)*puVar14 != 0x7d)) {
    local_38 = CONCAT44(1,(flatcc_builder_ref_t)local_38);
    buf = (char *)puVar14;
LAB_00111aad:
    if (buf != end) {
      if ((byte)*(ulong *)buf == 0x2e) {
        buf = flatcc_json_parser_set_error(ctx,buf,end,5);
      }
      else if ((byte)*(ulong *)buf == 0x22) {
        buf = (char *)((long)buf + 1);
        ctx->unquoted = 0;
      }
      else {
        ctx->unquoted = 1;
      }
    }
    uVar8 = (long)end - (long)buf;
    puVar14 = (ulong *)buf;
    if (uVar8 < 8) {
      uVar9 = 0;
      uVar6 = 0;
      uVar10 = 0;
      uVar12 = 0;
      uVar13 = 0;
      uVar5 = 0;
      switch(uVar8) {
      case 7:
        uVar9 = (long)(char)*(byte *)((long)buf + 6) << 8;
      case 6:
        uVar6 = (long)(char)*(byte *)((long)buf + 5) << 0x10 | uVar9;
      case 5:
        uVar10 = (long)(char)*(byte *)((long)buf + 4) << 0x18 | uVar6;
      case 4:
        uVar12 = (long)(char)*(byte *)((long)buf + 3) << 0x20 | uVar10;
      case 3:
        uVar13 = (long)(char)*(byte *)((long)buf + 2) << 0x28 | uVar12;
      case 2:
        uVar5 = (long)(char)*(byte *)((long)buf + 1) << 0x30 | uVar13;
      case 1:
        uVar5 = (ulong)(byte)*(ulong *)buf << 0x38 | uVar5;
        goto LAB_00111b8a;
      }
    }
    else {
      uVar6 = *(ulong *)buf;
      uVar5 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
LAB_00111b8a:
      if (0x6e6573746563ffff < uVar5) {
        if (uVar5 >> 8 == 0x75726c64617461) {
          if (7 < (long)uVar8) {
            bVar1 = *(byte *)((long)buf + 7);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                buf_00 = (ulong *)((long)buf + 8);
                goto LAB_00111ced;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              buf_00 = (ulong *)((long)buf + 7);
              ctx->unquoted = 0;
LAB_00111ced:
              if ((long)end - (long)buf_00 < 2) {
LAB_00111d64:
                buf_00 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)buf_00,end);
              }
              else if ((char)(byte)*buf_00 < '!') {
                if (((byte)*buf_00 != 0x20) || ((char)*(byte *)((long)buf_00 + 1) < '!'))
                goto LAB_00111d64;
                buf_00 = (ulong *)((long)buf_00 + 1);
              }
              if ((buf_00 == (ulong *)end) || ((byte)*buf_00 != 0x3a)) {
                puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)buf_00,end,4);
              }
              else {
                puVar14 = (ulong *)((long)buf_00 + 1);
                if ((long)end - (long)puVar14 < 2) {
LAB_00111eb3:
                  puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                }
                else if ((char)*(byte *)puVar14 < '!') {
                  if ((*(byte *)puVar14 != 0x20) || ((char)*(byte *)((long)buf_00 + 2) < '!'))
                  goto LAB_00111eb3;
                  puVar14 = (ulong *)((long)buf_00 + 2);
                }
              }
            }
          }
          if ((ulong *)buf == puVar14) goto switchD_00111b30_default;
          buf = flatcc_json_parser_build_uint8_vector_base64
                          (ctx,(char *)puVar14,end,(flatcc_builder_ref_t *)&local_38,1);
          if ((flatcc_builder_ref_t)local_38 == 0) goto LAB_00111a12;
          B = ctx->ctx;
          iVar2 = 1;
        }
        else {
          if ((uVar5 & 0xffffffffffff0000) != 0x6e65737465640000) goto switchD_00111b30_default;
          if (6 < (long)uVar8) {
            bVar1 = *(byte *)((long)buf + 6);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar11 = (byte *)((long)buf + 7);
                goto LAB_00111df0;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar11 = (byte *)((long)buf + 6);
              ctx->unquoted = 0;
LAB_00111df0:
              if ((long)end - (long)pbVar11 < 2) {
LAB_00111e0e:
                pbVar11 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar11,end);
              }
              else if ((char)*pbVar11 < '!') {
                if ((*pbVar11 != 0x20) || ((char)pbVar11[1] < '!')) goto LAB_00111e0e;
                pbVar11 = pbVar11 + 1;
              }
              if ((pbVar11 == (byte *)end) || (*pbVar11 != 0x3a)) {
                puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar11,end,4);
              }
              else {
                puVar14 = (ulong *)(pbVar11 + 1);
                if ((long)end - (long)puVar14 < 2) {
LAB_00111ef4:
                  puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
                }
                else if ((char)(byte)*puVar14 < '!') {
                  if (((byte)*puVar14 != 0x20) || ((char)pbVar11[2] < '!')) goto LAB_00111ef4;
                  puVar14 = (ulong *)(pbVar11 + 2);
                }
              }
            }
          }
          if ((ulong *)buf == puVar14) goto switchD_00111b30_default;
          buf = flatcc_json_parser_build_uint8_vector_base64
                          (ctx,(char *)puVar14,end,(flatcc_builder_ref_t *)&local_38,0);
          if ((flatcc_builder_ref_t)local_38 == 0) goto LAB_00111a12;
          B = ctx->ctx;
          iVar2 = 2;
        }
LAB_00111f30:
        pfVar7 = flatcc_builder_table_add_offset(B,iVar2);
        if (pfVar7 == (flatcc_builder_ref_t *)0x0) goto LAB_00111a12;
        *pfVar7 = (flatcc_builder_ref_t)local_38;
        goto LAB_00111f56;
      }
      if ((uVar5 & 0x7fffffff00000000) != 0x6461746100000000) goto switchD_00111b30_default;
      if (4 < (long)uVar8) {
        bVar1 = *(byte *)((long)buf + 4);
        if (ctx->unquoted == 0) {
          if (bVar1 == 0x22) {
            pbVar11 = (byte *)((long)buf + 5);
            goto LAB_00111cbe;
          }
        }
        else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
          pbVar11 = (byte *)((long)buf + 4);
          ctx->unquoted = 0;
LAB_00111cbe:
          if ((long)end - (long)pbVar11 < 2) {
LAB_00111d0b:
            pbVar11 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar11,end);
          }
          else if ((char)*pbVar11 < '!') {
            if ((*pbVar11 != 0x20) || ((char)pbVar11[1] < '!')) goto LAB_00111d0b;
            pbVar11 = pbVar11 + 1;
          }
          if ((pbVar11 == (byte *)end) || (*pbVar11 != 0x3a)) {
            puVar14 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar11,end,4);
          }
          else {
            puVar14 = (ulong *)(pbVar11 + 1);
            if ((long)end - (long)puVar14 < 2) {
LAB_00111e74:
              puVar14 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar14,end);
            }
            else if ((char)(byte)*puVar14 < '!') {
              if (((byte)*puVar14 != 0x20) || ((char)pbVar11[2] < '!')) goto LAB_00111e74;
              puVar14 = (ulong *)(pbVar11 + 2);
            }
          }
        }
      }
      if ((ulong *)buf != puVar14) {
        buf = flatcc_json_parser_build_uint8_vector_base64
                        (ctx,(char *)puVar14,end,(flatcc_builder_ref_t *)&local_38,0);
        if ((flatcc_builder_ref_t)local_38 != 0) {
          B = ctx->ctx;
          iVar2 = 0;
          goto LAB_00111f30;
        }
        goto LAB_00111a12;
      }
    }
switchD_00111b30_default:
    buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar14,end);
LAB_00111f56:
    buf = flatcc_json_parser_object_end(ctx,buf,end,(int *)((long)&local_38 + 4));
    if (local_38._4_4_ == 0) goto LAB_00111a0b;
    goto LAB_00111aad;
  }
  local_38 = local_38 & 0xffffffff;
  buf = (char *)((long)puVar14 + 1);
  if ((long)end - (long)buf < 2) {
LAB_00111f8d:
    buf = flatcc_json_parser_space_ext(ctx,buf,end);
  }
  else if (*buf < '!') {
    if ((*buf != 0x20) || ((char)*(byte *)((long)puVar14 + 2) < '!')) goto LAB_00111f8d;
    buf = (char *)((long)puVar14 + 2);
  }
LAB_00111a0b:
  if (ctx->error == 0) {
    fVar3 = flatcc_builder_end_table(ctx->ctx);
    *result = fVar3;
    if (fVar3 != 0) {
      return (char *)(ulong *)buf;
    }
  }
LAB_00111a12:
  pcVar4 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar4;
}

Assistant:

static const char *MyGame_Example_TestBase64_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 3)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6e65737465640000) { /* branch "nested" */
            if ((w & 0xffffffff00000000) == 0x6461746100000000) { /* "data" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 4);
                if (mark != buf) {
                    buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 0);
                    if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                    *pref = ref;
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "data" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "data" */
        } else { /* branch "nested" */
            if ((w & 0xffffffffffffff00) == 0x75726c6461746100) { /* "urldata" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                if (mark != buf) {
                    buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 1);
                    if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 1))) goto failed;
                    *pref = ref;
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "urldata" */
                if ((w & 0xffffffffffff0000) == 0x6e65737465640000) { /* "nested" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                    if (mark != buf) {
                        buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 0);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 2))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "nested" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "nested" */
            } /* "urldata" */
        } /* branch "nested" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}